

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
ParamsStream<ParamsStream<serialize_tests::UncopyableStream,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>
::
ParamsStream<serialize_tests::UncopyableStream,serialize_tests::BaseFormat,serialize_tests::BaseFormat>
          (ParamsStream<ParamsStream<serialize_tests::UncopyableStream,_serialize_tests::BaseFormat>,_serialize_tests::BaseFormat>
           *this,UncopyableStream *s,BaseFormat *params1,BaseFormat *params2)

{
  ParamsStream<serialize_tests::UncopyableStream,_serialize_tests::BaseFormat> *in_RDI;
  long in_FS_OFFSET;
  ParamsStream<serialize_tests::UncopyableStream,_serialize_tests::BaseFormat>
  *in_stack_ffffffffffffff88;
  ParamsStream<ParamsStream<serialize_tests::UncopyableStream,_serialize_tests::BaseFormat>,_serialize_tests::BaseFormat>
  *this_00;
  ParamsStream<ParamsStream<serialize_tests::UncopyableStream,_serialize_tests::BaseFormat>,_serialize_tests::BaseFormat>
  local_30;
  
  local_30.m_substream.m_substream.super_DataStream.m_read_pos = *(size_type *)(in_FS_OFFSET + 0x28)
  ;
  this_00 = &local_30;
  ParamsStream<serialize_tests::UncopyableStream,_serialize_tests::BaseFormat>::ParamsStream
            ((ParamsStream<serialize_tests::UncopyableStream,_serialize_tests::BaseFormat> *)this_00
             ,(UncopyableStream *)in_RDI,(BaseFormat *)in_stack_ffffffffffffff88);
  ParamsStream<ParamsStream<serialize_tests::UncopyableStream,_serialize_tests::BaseFormat>,_serialize_tests::BaseFormat>
  ::ParamsStream(this_00,in_RDI,(BaseFormat *)in_stack_ffffffffffffff88);
  ParamsStream<serialize_tests::UncopyableStream,_serialize_tests::BaseFormat>::~ParamsStream
            (in_stack_ffffffffffffff88);
  if (*(size_type *)(in_FS_OFFSET + 0x28) ==
      local_30.m_substream.m_substream.super_DataStream.m_read_pos) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ParamsStream(NestedSubstream&& s, const Params1& params1 LIFETIMEBOUND, const Params2& params2 LIFETIMEBOUND, const NestedParams&... params LIFETIMEBOUND)
        : ParamsStream{::ParamsStream{std::forward<NestedSubstream>(s), params2, params...}, params1} {}